

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O1

exr_result_t
exr_get_scanlines_per_chunk(exr_const_context_t_conflict ctxt,int part_index,int32_t *out)

{
  exr_result_t eVar1;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar1 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar1;
    }
    if (out == (int32_t *)0x0) {
      eVar1 = 3;
    }
    else {
      if ((ctxt->parts[(uint)part_index]->storage_mode & ~EXR_STORAGE_DEEP_SCANLINE) !=
          EXR_STORAGE_SCANLINE) {
        *out = -1;
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
        }
        eVar1 = (*ctxt->standard_error)(ctxt,0x12);
        return eVar1;
      }
      *out = (int)ctxt->parts[(uint)part_index]->lines_per_chunk;
      eVar1 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_get_scanlines_per_chunk (
    exr_const_context_t ctxt, int part_index, int32_t* out)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!out) return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_INVALID_ARGUMENT);

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        *out = part->lines_per_chunk;
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }
    *out = -1;
    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_SCAN_TILE_MIXEDAPI));
}